

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  short sVar3;
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  ImDrawList *draw_list;
  uint uVar7;
  ImGuiContext *pIVar8;
  ImGuiWindow *pIVar9;
  ImVec2 IVar10;
  bool bVar11;
  bool bVar12;
  ImU32 id;
  uint flags_00;
  ImU32 col;
  ImGuiID close_button_id;
  size_t sVar13;
  undefined8 extraout_RAX;
  char *pcVar14;
  ImS32 IVar15;
  int iVar16;
  bool *pbVar17;
  ImGuiCol idx;
  bool is_contents_visible;
  float fVar18;
  ImVec2 IVar19;
  bool text_clipped;
  bool just_closed;
  ImGuiWindow *local_d0;
  ImDrawList *local_c8;
  ImGuiTabItem *local_c0;
  uint local_b4;
  uint local_b0;
  int local_ac;
  ImVec2 local_a8;
  bool held;
  float local_9c;
  bool hovered;
  float fStack_94;
  uint local_8c;
  float local_88;
  float fStack_84;
  ImRect bb;
  bool local_68;
  
  pIVar8 = GImGui;
  if (tab_bar->WantLayout == true) {
    uVar4 = *(undefined4 *)&(GImGui->NextItemData).OpenVal;
    bb.Min.x = (float)(GImGui->NextItemData).Flags;
    bb.Min.y = (GImGui->NextItemData).Width;
    bb.Max.x = (float)(GImGui->NextItemData).FocusScopeId;
    bb.Max.y = (float)(GImGui->NextItemData).OpenCond;
    TabBarLayout(tab_bar);
    local_68 = SUB41(uVar4,0);
    (pIVar8->NextItemData).OpenVal = local_68;
    (pIVar8->NextItemData).Flags = (ImGuiNextItemDataFlags)bb.Min.x;
    (pIVar8->NextItemData).Width = bb.Min.y;
    (pIVar8->NextItemData).FocusScopeId = (ImGuiID)bb.Max.x;
    (pIVar8->NextItemData).OpenCond = (ImGuiCond)bb.Max.y;
  }
  local_d0 = pIVar8->CurrentWindow;
  if (local_d0->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,8);
    return false;
  }
  pbVar17 = (bool *)0x0;
  flags_00 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    pbVar17 = p_open;
    flags_00 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    flags_00 = flags;
  }
  local_c0 = TabBarFindTabByID(tab_bar,id);
  local_a8 = (ImVec2)local_c0;
  if (local_c0 == (ImGuiTabItem *)0x0) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = -NAN;
    bb.Max.y = -NAN;
    ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)&bb);
    local_c0 = (tab_bar->Tabs).Data + (long)(tab_bar->Tabs).Size + -1;
    local_c0->ID = id;
    tab_bar->TabsAddedNew = true;
  }
  tab_bar->LastTabItemIdx = (ImS16)(((long)local_c0 - (long)(tab_bar->Tabs).Data) / 0x2c);
  IVar19 = TabItemCalcSize(label,(bool)((byte)flags_00 & 1 | pbVar17 != (bool *)0x0));
  IVar10 = local_a8;
  local_88 = IVar19.x;
  fStack_84 = IVar19.y;
  local_c0->RequestedWidth = -1.0;
  if (((pIVar8->NextItemData).Flags & 1) != 0) {
    local_88 = (pIVar8->NextItemData).Width;
    local_c0->RequestedWidth = local_88;
  }
  if (local_a8 == (ImVec2)0x0) {
    fVar2 = 1.0;
    if (1.0 <= local_88) {
      fVar2 = local_88;
    }
    local_c0->Width = fVar2;
  }
  local_c0->ContentWidth = local_88;
  sVar3 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar3 + 1;
  local_c0->BeginOrder = sVar3;
  local_8c = 0;
  if ((flags_00 & 1) != 0) {
    local_8c = (uint)((local_c0->Flags & 1) == 0);
  }
  local_b0 = tab_bar->Flags;
  iVar16 = tab_bar->PrevFrameVisible + 1;
  local_ac = local_c0->LastFrameVisible + 1;
  local_c8 = (ImDrawList *)CONCAT44(local_c8._4_4_,pIVar8->FrameCount);
  local_c0->LastFrameVisible = pIVar8->FrameCount;
  local_c0->Flags = flags_00;
  iVar5 = (tab_bar->TabsNames).Buf.Size;
  IVar15 = iVar5 + -1;
  if (iVar5 == 0) {
    IVar15 = 0;
  }
  local_c0->NameOffset = IVar15;
  sVar13 = strlen(label);
  ImGuiTextBuffer::append(&tab_bar->TabsNames,label,label + sVar13 + 1);
  if ((flags_00 >> 0x15 & 1) == 0) {
    if ((((local_ac < (int)local_c8) && ((tab_bar->Flags & 2) != 0)) &&
        (tab_bar->NextSelectedTabId == 0)) &&
       (((int)local_c8 <= iVar16 || (tab_bar->SelectedTabId == 0)))) {
      tab_bar->NextSelectedTabId = id;
    }
    if (((flags_00 & 2) != 0) && (tab_bar->SelectedTabId != id)) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    is_contents_visible = true;
  }
  else if ((tab_bar->SelectedTabId == 0 && iVar16 < (int)local_c8) && ((tab_bar->Tabs).Size == 1)) {
    is_contents_visible = (tab_bar->Flags & 2) == 0;
  }
  else {
    is_contents_visible = false;
  }
  if ((local_ac < (int)local_c8) && (IVar10 == (ImVec2)0x0 || (int)local_c8 <= iVar16)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,8);
    return (bool)((flags_00 >> 0x15 & 1) == 0 & is_contents_visible);
  }
  if (tab_bar->SelectedTabId == id) {
    local_c0->LastFrameSelected = pIVar8->FrameCount;
  }
  uVar6 = local_c0->Flags;
  fVar2 = local_c0->Width;
  fVar18 = local_c0->Offset;
  if ((uVar6 & 0xc0) == 0) {
    fVar18 = (float)(int)(fVar18 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar18 + (tab_bar->BarRect).Min.x;
  local_a8 = (local_d0->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar19.y = bb.Min.y;
  IVar19.x = bb.Min.x;
  (local_d0->DC).CursorPos = IVar19;
  bb.Max.x = fVar2 + bb.Min.x;
  bb.Max.y = fStack_84 + bb.Min.y;
  if ((uVar6 & 0xc0) == 0) {
    fVar2 = tab_bar->ScrollingRectMinX;
    if ((fVar2 <= bb.Min.x) && (bb.Max.x <= tab_bar->ScrollingRectMaxX)) goto LAB_001fb506;
    fStack_94 = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar2 <= bb.Min.x) & (uint)fVar2 |
                      (uint)bb.Min.x & -(uint)(fVar2 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_9c = bb.Max.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    local_88 = (float)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
LAB_001fb506:
    local_88 = 0.0;
  }
  pIVar9 = local_d0;
  _hovered = bb.Max.x - bb.Min.x;
  fStack_94 = bb.Max.y - bb.Min.y;
  IVar19 = (local_d0->DC).CursorMaxPos;
  ItemSize((ImVec2 *)&hovered,(pIVar8->Style).FramePadding.y);
  (pIVar9->DC).CursorMaxPos = IVar19;
  bVar11 = ItemAdd(&bb,id,(ImRect *)0x0,0);
  if (!bVar11) {
    if (local_88._0_1_ != '\0') {
      PopClipRect();
    }
    (local_d0->DC).CursorPos = local_a8;
    return is_contents_visible;
  }
  local_b4 = flags_00 & 0x200000;
  bVar11 = ButtonBehavior(&bb,id,&hovered,&held,
                          (local_b4 >> 0x11) + (uint)pIVar8->DragDropActive * 0x200 + 0x1010);
  if ((bVar11) && (local_b4 == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (pIVar8->ActiveId != id) {
    SetItemAllowOverlap();
  }
  if (((((held == true) && ((int)local_c8 <= local_ac)) &&
       (bVar12 = IsMouseDragging(0,-1.0), bVar12)) &&
      ((pIVar8->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) &&
     (((fVar2 = (pIVar8->IO).MouseDelta.x, fVar2 < 0.0 &&
       (pIVar1 = &(pIVar8->IO).MousePos, pIVar1->x <= bb.Min.x && bb.Min.x != pIVar1->x)) ||
      ((0.0 < fVar2 && (bb.Max.x < (pIVar8->IO).MousePos.x)))))) {
    TabBarQueueReorderFromMousePos(tab_bar,local_c0,(pIVar8->IO).MousePos);
  }
  draw_list = local_d0->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (is_contents_visible == false) {
      idx = (uint)((local_b0 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_b0 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  local_c8 = draw_list;
  TabItemBackground(draw_list,&bb,flags_00,col);
  RenderNavHighlight(&bb,id,1);
  bVar12 = IsItemHovered(0x20);
  if (bVar12) {
    bVar12 = IsMouseClicked(1,false);
    if (bVar12) {
      uVar6 = flags_00 >> 0x15 & 1;
    }
    else {
      bVar12 = IsMouseReleased(1);
      uVar6 = local_b4;
      if (!bVar12) goto LAB_001fb785;
    }
    if (uVar6 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_001fb785:
  uVar6 = tab_bar->Flags;
  if (pbVar17 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
  }
  uVar7 = flags_00 & 0xfffffffe;
  if ((char)local_8c == '\0') {
    uVar7 = flags_00;
  }
  TabItemLabelAndCloseButton
            (local_c8,&bb,uVar6 >> 1 & 4 | uVar7,tab_bar->FramePadding,label,id,close_button_id,
             is_contents_visible,&just_closed,&text_clipped);
  if ((pbVar17 != (bool *)0x0) && (just_closed != false)) {
    *pbVar17 = false;
    TabBarCloseTab(tab_bar,local_c0);
  }
  if (local_88._0_1_ != '\0') {
    PopClipRect();
  }
  (local_d0->DC).CursorPos = local_a8;
  if ((((text_clipped == true) && (pIVar8->HoveredId == id)) && (held == false)) &&
     ((((tab_bar->Flags & 0x20) == 0 && ((local_c0->Flags & 0x10) == 0)) &&
      (bVar12 = IsItemHovered(0x800), bVar12)))) {
    pcVar14 = FindRenderedTextEnd(label,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar14 - (int)label),label);
  }
  if ((flags_00 >> 0x15 & 1) == 0) {
    bVar11 = is_contents_visible;
  }
  return bVar11;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    ImGuiContext& g = *GImGui;
    if (tab_bar->WantLayout)
    {
        ImGuiNextItemData backup_next_item_data = g.NextItemData;
        TabBarLayout(tab_bar);
        g.NextItemData = backup_next_item_data;
    }
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    if (p_open && !*p_open)
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav);
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab_bar->TabsAddedNew = tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, (p_open != NULL) || (flags & ImGuiTabItemFlags_UnsavedDocument));
    tab->RequestedWidth = -1.0f;
    if (g.NextItemData.Flags & ImGuiNextItemDataFlags_HasWidth)
        size.x = tab->RequestedWidth = g.NextItemData.Width;
    if (tab_is_new)
        tab->Width = ImMax(1.0f, size.x);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool tab_just_unsaved = (flags & ImGuiTabItemFlags_UnsavedDocument) && !(tab->Flags & ImGuiTabItemFlags_UnsavedDocument);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (!is_tab_button)
    {
        if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
            if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
        if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // _SetSelected can only be passed on explicit tab bar
            tab_bar->NextSelectedTabId = id;
    }

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav);
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, tab_just_unsaved ? (flags & ~ImGuiTabItemFlags_UnsavedDocument) : flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip
    // (Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer-> seems ok)
    // (We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar, which g.HoveredId ignores)
    // FIXME: This is a mess.
    // FIXME: We may want disabled tab to still display the tooltip?
    if (text_clipped && g.HoveredId == id && !held)
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            if (IsItemHovered(ImGuiHoveredFlags_DelayNormal))
                SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}